

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O2

void multiscale_help(char *name)

{
  printf("usage: \n %s multiscale input_mesh.extension scalar.{solb,snap} complexity metric.solb\n",
         name);
  puts("   complexity is approximately half the target number of vertices");
  putchar(10);
  puts("  options:");
  puts("   --norm-power <power> multiscale metric norm power (default 2)");
  puts("   --gradation <gradation> (default -1)");
  puts("       positive: metric-space gradation stretching ratio.");
  puts("       negative: mixed-space gradation.");
  puts("   --buffer coarsens the metric approaching the x max boundary.");
  option_uniform_help();
  puts("   --hessian expects hessian.* in place of scalar.{solb,snap}.");
  puts("   --pcd <project.pcd> exports isotropic spacing point cloud.");
  puts("   --combine <scalar2.solb> <scalar2 ratio>.");
  puts("   --aspect-ratio <aspect ratio limit>.");
  putchar(10);
  return;
}

Assistant:

static void multiscale_help(const char *name) {
  printf(
      "usage: \n %s multiscale input_mesh.extension scalar.{solb,snap} "
      "complexity metric.solb\n",
      name);
  printf("   complexity is approximately half the target number of vertices\n");
  printf("\n");
  printf("  options:\n");
  printf("   --norm-power <power> multiscale metric norm power (default 2)\n");
  printf("   --gradation <gradation> (default -1)\n");
  printf("       positive: metric-space gradation stretching ratio.\n");
  printf("       negative: mixed-space gradation.\n");
  printf("   --buffer coarsens the metric approaching the x max boundary.\n");
  option_uniform_help();
  printf("   --hessian expects hessian.* in place of scalar.{solb,snap}.\n");
  printf("   --pcd <project.pcd> exports isotropic spacing point cloud.\n");
  printf("   --combine <scalar2.solb> <scalar2 ratio>.\n");
  printf("   --aspect-ratio <aspect ratio limit>.\n");
  printf("\n");
}